

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

int __thiscall jpge::cfile_stream::open(cfile_stream *this,char *__file,int __oflag,...)

{
  int iVar1;
  FILE *pFVar2;
  
  if ((FILE *)this->m_pFile != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->m_pFile);
    if (iVar1 == -1) {
      this->m_bStatus = false;
    }
    this->m_pFile = (FILE *)0x0;
  }
  pFVar2 = fopen(__file,"wb");
  this->m_pFile = (FILE *)pFVar2;
  this->m_bStatus = pFVar2 != (FILE *)0x0;
  return (int)CONCAT71((int7)((ulong)pFVar2 >> 8),pFVar2 != (FILE *)0x0);
}

Assistant:

bool open(const char* pFilename)
		{
			close();
			m_pFile = fopen(pFilename, "wb");
			m_bStatus = (m_pFile != NULL);
			return m_bStatus;
		}